

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O2

QVariant * __thiscall QTabBar::tabData(QVariant *__return_storage_ptr__,QTabBar *this,int index)

{
  long lVar1;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (((ulong)(long)index < *(ulong *)(lVar1 + 0x2e8)) &&
     (lVar1 = *(long *)(*(long *)(lVar1 + 0x2e0) + (long)index * 8), lVar1 != 0)) {
    ::QVariant::QVariant(__return_storage_ptr__,(QVariant *)(lVar1 + 0xa8));
  }
  else {
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QTabBar::tabData(int index) const
{
    Q_D(const QTabBar);
    if (const QTabBarPrivate::Tab *tab = d->at(index))
        return tab->data;
    return QVariant();
}